

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeTabBar(ImGuiTabBar *tab_bar,char *label)

{
  ImVector<unsigned_int> *pIVar1;
  ImGuiTabItem *tab;
  int iVar2;
  uint uVar3;
  ImGuiTabItem *pIVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  char *pcVar8;
  ImDrawList *this;
  long lVar9;
  int tab_n;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ImVec2 local_148;
  ImVec2 local_140;
  char buf [256];
  
  iVar2 = tab_bar->PrevFrameVisible;
  iVar12 = GImGui->FrameCount + -2;
  pcVar8 = " *Inactive*";
  if (iVar12 <= iVar2) {
    pcVar8 = "";
  }
  ImFormatString(buf,0x100,"%s 0x%08X (%d tabs)%s",label,(ulong)tab_bar->ID,
                 (ulong)(uint)(tab_bar->Tabs).Size,pcVar8);
  if (iVar2 < iVar12) {
    PushStyleColor(0,(GImGui->Style).Colors + 1);
  }
  bVar6 = TreeNode(tab_bar,"%s",buf);
  if (iVar2 < iVar12) {
    PopStyleColor(1);
  }
  else {
    bVar7 = IsItemHovered(0);
    if (bVar7) {
      this = GetForegroundDrawList();
      ImDrawList::AddRect(this,&(tab_bar->BarRect).Min,&(tab_bar->BarRect).Max,0xff00ffff,0.0,0xf,
                          1.0);
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMinX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMaxX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
    }
  }
  if (bVar6) {
    lVar11 = 0;
    for (uVar10 = 0; (long)uVar10 < (long)(tab_bar->Tabs).Size; uVar10 = uVar10 + 1) {
      pIVar4 = (tab_bar->Tabs).Data;
      tab = (ImGuiTabItem *)((long)&pIVar4->ID + lVar11);
      PushID(tab);
      bVar6 = SmallButton("<");
      if (bVar6) {
        TabBarQueueReorder(tab_bar,tab,-1);
      }
      SameLine(0.0,2.0);
      bVar6 = SmallButton(">");
      if (bVar6) {
        TabBarQueueReorder(tab_bar,tab,1);
      }
      SameLine(0.0,-1.0);
      uVar3 = *(uint *)((long)&pIVar4->ID + lVar11);
      uVar5 = 0x20;
      if (uVar3 == tab_bar->SelectedTabId) {
        uVar5 = 0x2a;
      }
      lVar9 = (long)*(short *)((long)&pIVar4->NameOffset + lVar11);
      pcVar8 = "";
      if (lVar9 != -1) {
        pcVar8 = (tab_bar->TabsNames).Buf.Data + lVar9;
      }
      Text("%02d%c Tab 0x%08X \'%s\' Offset: %.1f, Width: %.1f/%.1f",
           (double)*(float *)((long)&pIVar4->Offset + lVar11),
           (double)*(float *)((long)&pIVar4->Width + lVar11),
           (double)*(float *)((long)&pIVar4->ContentWidth + lVar11),uVar10 & 0xffffffff,uVar5,
           (ulong)uVar3,pcVar8);
      pIVar1 = &GImGui->CurrentWindow->IDStack;
      pIVar1->Size = pIVar1->Size + -1;
      lVar11 = lVar11 + 0x24;
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTabBar(ImGuiTabBar* tab_bar, const char* label)
{
    // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
    char buf[256];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (tab_bar->PrevFrameVisible >= GetFrameCount() - 2);
    p += ImFormatString(p, buf_end - p, "%s 0x%08X (%d tabs)%s", label, tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
    IM_UNUSED(p);
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(tab_bar, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (is_active && IsItemHovered())
    {
        ImDrawList* draw_list = GetForegroundDrawList();
        draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
    }
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            PushID(tab);
            if (SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } SameLine(0, 2);
            if (SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } SameLine();
            Text("%02d%c Tab 0x%08X '%s' Offset: %.1f, Width: %.1f/%.1f",
                tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "", tab->Offset, tab->Width, tab->ContentWidth);
            PopID();
        }
        TreePop();
    }
}